

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O2

ENetProtocolCommand
enet_protocol_remove_sent_reliable_command
          (ENetPeer *peer,enet_uint16 reliableSequenceNumber,enet_uint8 channelID)

{
  byte *pbVar1;
  ENetList *pEVar2;
  ENetChannel *pEVar3;
  ENetPacket *packet;
  ulong uVar4;
  enet_uint16 eVar5;
  byte bVar6;
  _ENetListNode *p_Var7;
  _ENetListNode *position;
  
  pEVar2 = &peer->sentReliableCommands;
  p_Var7 = &pEVar2->sentinel;
  do {
    p_Var7 = ((ENetListNode *)&p_Var7->next)->next;
    if (p_Var7 == &pEVar2->sentinel) {
      position = &(peer->outgoingReliableCommands).sentinel;
      goto LAB_00107133;
    }
  } while ((*(enet_uint16 *)&p_Var7[1].next != reliableSequenceNumber) ||
          (position = p_Var7, *(enet_uint8 *)((long)&p_Var7[2].previous + 1) != channelID));
  goto LAB_00107158;
  while ((*(enet_uint16 *)&position[1].next != reliableSequenceNumber ||
         (*(enet_uint8 *)((long)&position[2].previous + 1) != channelID))) {
LAB_00107133:
    position = ((ENetListNode *)&position->next)->next;
    if ((position == &(peer->outgoingReliableCommands).sentinel) ||
       (*(short *)((long)&position[2].next + 6) == 0)) {
      bVar6 = 0;
      goto LAB_001071e2;
    }
  }
LAB_00107158:
  uVar4 = (ulong)channelID;
  if (uVar4 < peer->channelCount) {
    pEVar3 = peer->channels;
    if ((pEVar3[uVar4].reliableWindows[reliableSequenceNumber >> 0xc] != 0) &&
       (eVar5 = pEVar3[uVar4].reliableWindows[reliableSequenceNumber >> 0xc] - 1,
       pEVar3[uVar4].reliableWindows[reliableSequenceNumber >> 0xc] = eVar5, eVar5 == 0)) {
      bVar6 = (byte)(reliableSequenceNumber >> 0xc);
      pEVar3[uVar4].usedReliableWindows =
           pEVar3[uVar4].usedReliableWindows & (-2 << bVar6 | 0xfffeU >> 0x10 - bVar6);
    }
  }
  bVar6 = *(byte *)&position[2].previous;
  enet_list_remove(position);
  packet = (ENetPacket *)position[6].next;
  if (packet != (ENetPacket *)0x0) {
    if (p_Var7 != &pEVar2->sentinel) {
      peer->reliableDataInTransit =
           peer->reliableDataInTransit - (uint)*(ushort *)((long)&position[2].next + 4);
    }
    packet->referenceCount = packet->referenceCount - 1;
    if (packet->referenceCount == 0) {
      pbVar1 = (byte *)((long)&packet->flags + 1);
      *pbVar1 = *pbVar1 | 1;
      enet_packet_destroy(packet);
    }
  }
  bVar6 = bVar6 & 0xf;
  enet_free(position);
  p_Var7 = (pEVar2->sentinel).next;
  if (p_Var7 != &pEVar2->sentinel) {
    peer->nextTimeout = *(int *)&p_Var7[1].previous + *(int *)((long)&p_Var7[1].next + 4);
  }
LAB_001071e2:
  return (ENetProtocolCommand)bVar6;
}

Assistant:

static ENetProtocolCommand
enet_protocol_remove_sent_reliable_command (ENetPeer * peer, enet_uint16 reliableSequenceNumber, enet_uint8 channelID)
{
    ENetOutgoingCommand * outgoingCommand = NULL;
    ENetListIterator currentCommand;
    ENetProtocolCommand commandNumber;
    int wasSent = 1;

    for (currentCommand = enet_list_begin (& peer -> sentReliableCommands);
         currentCommand != enet_list_end (& peer -> sentReliableCommands);
         currentCommand = enet_list_next (currentCommand))
    {
       outgoingCommand = (ENetOutgoingCommand *) currentCommand;
        
       if (outgoingCommand -> reliableSequenceNumber == reliableSequenceNumber &&
           outgoingCommand -> command.header.channelID == channelID)
         break;
    }

    if (currentCommand == enet_list_end (& peer -> sentReliableCommands))
    {
       for (currentCommand = enet_list_begin (& peer -> outgoingReliableCommands);
            currentCommand != enet_list_end (& peer -> outgoingReliableCommands);
            currentCommand = enet_list_next (currentCommand))
       {
          outgoingCommand = (ENetOutgoingCommand *) currentCommand;

          if (outgoingCommand -> sendAttempts < 1) return ENET_PROTOCOL_COMMAND_NONE;

          if (outgoingCommand -> reliableSequenceNumber == reliableSequenceNumber &&
              outgoingCommand -> command.header.channelID == channelID)
            break;
       }

       if (currentCommand == enet_list_end (& peer -> outgoingReliableCommands))
         return ENET_PROTOCOL_COMMAND_NONE;

       wasSent = 0;
    }

    if (outgoingCommand == NULL)
      return ENET_PROTOCOL_COMMAND_NONE;

    if (channelID < peer -> channelCount)
    {
       ENetChannel * channel = & peer -> channels [channelID];
       enet_uint16 reliableWindow = reliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;
       if (channel -> reliableWindows [reliableWindow] > 0)
       {
          -- channel -> reliableWindows [reliableWindow];
          if (! channel -> reliableWindows [reliableWindow])
            channel -> usedReliableWindows &= ~ (1 << reliableWindow);
       }
    }

    commandNumber = (ENetProtocolCommand) (outgoingCommand -> command.header.command & ENET_PROTOCOL_COMMAND_MASK);
    
    enet_list_remove (& outgoingCommand -> outgoingCommandList);

    if (outgoingCommand -> packet != NULL)
    {
       if (wasSent)
         peer -> reliableDataInTransit -= outgoingCommand -> fragmentLength;

       -- outgoingCommand -> packet -> referenceCount;

       if (outgoingCommand -> packet -> referenceCount == 0)
       {
          outgoingCommand -> packet -> flags |= ENET_PACKET_FLAG_SENT;

          enet_packet_destroy (outgoingCommand -> packet);
       }
    }

    enet_free (outgoingCommand);

    if (enet_list_empty (& peer -> sentReliableCommands))
      return commandNumber;
    
    outgoingCommand = (ENetOutgoingCommand *) enet_list_front (& peer -> sentReliableCommands);
    
    peer -> nextTimeout = outgoingCommand -> sentTime + outgoingCommand -> roundTripTimeout;

    return commandNumber;
}